

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_debugXML(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  xmlDocPtr pxVar6;
  xmlNodePtr pxVar7;
  xmlXPathObjectPtr pxVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int nr;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  xmlDocPtr pxVar9;
  ulong uVar10;
  xmlDocPtr in_RSI;
  int n_output;
  int iVar11;
  uint uVar12;
  int n_boolval;
  uint no;
  int local_44;
  int local_40;
  int local_3c;
  int test_ret;
  int test_ret_1;
  
  if (quiet == '\0') {
    puts("Testing debugXML : 25 of 28 functions ...");
  }
  iVar11 = 0;
  pxVar9 = (xmlDocPtr)0x0;
  while (iVar4 = (int)pxVar9, iVar4 != 4) {
    iVar1 = xmlMemBlocks();
    iVar2 = gen_int(iVar4,(int)in_RSI);
    xmlBoolToText(iVar2);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBoolToText",(ulong)(uint)(iVar2 - iVar1));
      iVar11 = iVar11 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar9;
    }
    pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    pxVar9 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar9, iVar4 != 4) {
      iVar2 = xmlMemBlocks();
      iVar1 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(iVar4,iVar1);
      in_RSI = pxVar6;
      xmlDebugCheckDocument(pFVar5);
      call_tests = call_tests + 1;
      iVar1 = extraout_EDX;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar1 = extraout_EDX_00;
      }
      des_xmlDocPtr((int)pxVar6,in_RSI,iVar1);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugCheckDocument",(ulong)(uint)(iVar1 - iVar2));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar4 = (int)uVar10, iVar4 != 2) {
      pxVar9 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar9, iVar1 != 4) {
        iVar2 = xmlMemBlocks();
        iVar3 = 0x15487f;
        pFVar5 = fopen64("test.out","a+");
        in_RSI = (xmlDocPtr)gen_xmlAttrPtr(iVar4,iVar3);
        iVar3 = gen_int(iVar1,iVar3);
        xmlDebugDumpAttr(pFVar5,in_RSI,iVar3);
        call_tests = call_tests + 1;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
        }
        if (iVar4 == 0) {
          free_api_doc();
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttr",(ulong)(uint)(iVar3 - iVar2));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar10 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar4 = (int)uVar10, iVar4 != 2) {
      pxVar9 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar9, iVar1 != 4) {
        iVar2 = xmlMemBlocks();
        iVar3 = 0x15487f;
        pFVar5 = fopen64("test.out","a+");
        in_RSI = (xmlDocPtr)gen_xmlAttrPtr(iVar4,iVar3);
        iVar3 = gen_int(iVar1,iVar3);
        xmlDebugDumpAttrList(pFVar5,in_RSI,iVar3);
        call_tests = call_tests + 1;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
        }
        if (iVar4 == 0) {
          free_api_doc();
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttrList",(ulong)(uint)(iVar3 - iVar2));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar10 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    pxVar9 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar9, iVar4 != 3) {
      iVar2 = xmlMemBlocks();
      iVar1 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      in_RSI = (xmlDocPtr)gen_xmlDtdPtr(iVar4,iVar1);
      xmlDebugDumpDTD(pFVar5,in_RSI);
      call_tests = call_tests + 1;
      iVar1 = extraout_EDX_01;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar1 = extraout_EDX_02;
      }
      des_xmlDtdPtr(iVar4,(xmlDtdPtr)in_RSI,iVar1);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDTD",(ulong)(uint)(iVar1 - iVar2));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = local_44 + iVar11 + test_ret;
  test_ret = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    pxVar9 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar9, iVar4 != 4) {
      iVar2 = xmlMemBlocks();
      iVar1 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(iVar4,iVar1);
      in_RSI = pxVar6;
      xmlDebugDumpDocument(pFVar5);
      call_tests = call_tests + 1;
      iVar1 = extraout_EDX_03;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar1 = extraout_EDX_04;
      }
      des_xmlDocPtr((int)pxVar6,in_RSI,iVar1);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocument",(ulong)(uint)(iVar1 - iVar2));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = iVar11 + local_3c;
  local_3c = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    pxVar9 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar9, iVar4 != 4) {
      iVar2 = xmlMemBlocks();
      iVar1 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(iVar4,iVar1);
      in_RSI = pxVar6;
      xmlDebugDumpDocumentHead(pFVar5);
      call_tests = call_tests + 1;
      iVar1 = extraout_EDX_05;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar1 = extraout_EDX_06;
      }
      des_xmlDocPtr((int)pxVar6,in_RSI,iVar1);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocumentHead",(ulong)(uint)(iVar1 - iVar2));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    pxVar9 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar9, iVar4 != 4) {
      iVar2 = xmlMemBlocks();
      iVar1 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(iVar4,iVar1);
      in_RSI = pxVar6;
      xmlDebugDumpEntities(pFVar5);
      call_tests = call_tests + 1;
      iVar1 = extraout_EDX_07;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar1 = extraout_EDX_08;
      }
      des_xmlDocPtr((int)pxVar6,in_RSI,iVar1);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpEntities",(ulong)(uint)(iVar1 - iVar2));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = iVar11 + local_40 + test_ret;
  test_ret = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar4 = (int)uVar10, iVar4 != 3) {
      pxVar9 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar9, iVar1 != 4) {
        iVar3 = xmlMemBlocks();
        iVar2 = 0x15487f;
        pFVar5 = fopen64("test.out","a+");
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar4,iVar2);
        iVar2 = gen_int(iVar1,iVar2);
        xmlDebugDumpNode(pFVar5,in_RSI,iVar2);
        call_tests = call_tests + 1;
        iVar2 = extraout_EDX_09;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          iVar2 = extraout_EDX_10;
        }
        des_xmlNodePtr(iVar4,(xmlNodePtr)in_RSI,iVar2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar3 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpNode",(ulong)(uint)(iVar2 - iVar3));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar10 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = iVar11 + local_3c;
  local_3c = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar4 = (int)uVar10, iVar4 != 3) {
      pxVar9 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar9, iVar1 != 4) {
        iVar3 = xmlMemBlocks();
        iVar2 = 0x15487f;
        pFVar5 = fopen64("test.out","a+");
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar4,iVar2);
        iVar2 = gen_int(iVar1,iVar2);
        xmlDebugDumpNodeList(pFVar5,in_RSI,iVar2);
        call_tests = call_tests + 1;
        iVar2 = extraout_EDX_11;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          iVar2 = extraout_EDX_12;
        }
        des_xmlNodePtr(iVar4,(xmlNodePtr)in_RSI,iVar2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar3 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpNodeList",(ulong)(uint)(iVar2 - iVar3));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar10 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = iVar11 + test_ret_1;
  test_ret_1 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar4 = (int)uVar10, iVar4 != 3) {
      pxVar9 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar9, iVar1 != 4) {
        iVar3 = xmlMemBlocks();
        iVar2 = 0x15487f;
        pFVar5 = fopen64("test.out","a+");
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar4,iVar2);
        iVar2 = gen_int(iVar1,iVar2);
        xmlDebugDumpOneNode(pFVar5,in_RSI,iVar2);
        call_tests = call_tests + 1;
        iVar2 = extraout_EDX_13;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          iVar2 = extraout_EDX_14;
        }
        des_xmlNodePtr(iVar4,(xmlNodePtr)in_RSI,iVar2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar3 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpOneNode",(ulong)(uint)(iVar2 - iVar3));
          test_ret_1 = test_ret_1 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar10 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar10 = 0; (int)uVar10 != 2; uVar10 = (ulong)((int)uVar10 + 1)) {
    pxVar9 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar9, iVar4 != 5) {
      iVar1 = xmlMemBlocks();
      iVar2 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar4,iVar2);
      xmlDebugDumpString(pFVar5);
      call_tests = call_tests + 1;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpString",(ulong)(uint)(iVar2 - iVar1));
        local_40 = local_40 + 1;
        printf(" %d",uVar10);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  iVar11 = iVar11 + test_ret + local_3c;
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar12 = 0; iVar4 = (int)in_RSI, uVar12 != 3; uVar12 = uVar12 + 1) {
    iVar1 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar12,iVar4);
    xmlLsCountNode(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar12,(xmlNodePtr)in_RSI,nr);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar1 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLsCountNode",(ulong)(uint)(iVar4 - iVar1));
      test_ret = test_ret + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    for (no = 0; no != 3; no = no + 1) {
      iVar1 = xmlMemBlocks();
      iVar4 = 0x15487f;
      pFVar5 = fopen64("test.out","a+");
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(no,iVar4);
      xmlLsOneNode(pFVar5,in_RSI);
      call_tests = call_tests + 1;
      iVar4 = extraout_EDX_15;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar4 = extraout_EDX_16;
      }
      des_xmlNodePtr(no,(xmlNodePtr)in_RSI,iVar4);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar1 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlLsOneNode",(ulong)(uint)(iVar4 - iVar1));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar12);
        in_RSI = (xmlDocPtr)(ulong)no;
        printf(" %d");
        putchar(10);
      }
    }
  }
  iVar11 = iVar11 + test_ret_1 + local_40;
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_40 = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellBase(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_00);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_01);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellBase",(ulong)(uint)(iVar1 - iVar3));
            local_40 = local_40 + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + test_ret;
  function_tests = function_tests + 1;
  uVar10 = 1;
  test_ret = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellCat(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_02);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_03);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellCat",(ulong)(uint)(iVar1 - iVar3));
            test_ret = test_ret + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + local_3c;
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_3c = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellDir(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_04);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_05);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellDir",(ulong)(uint)(iVar1 - iVar3));
            local_3c = local_3c + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + local_40;
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_40 = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellDu(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_06);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_07);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellDu",(ulong)(uint)(iVar1 - iVar3));
            local_40 = local_40 + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + test_ret;
  function_tests = function_tests + 1;
  uVar10 = 1;
  test_ret = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellList(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_08);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_09);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellList",(ulong)(uint)(iVar1 - iVar3));
            test_ret = test_ret + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + local_3c;
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_3c = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellLoad(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_10);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_11);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellLoad",(ulong)(uint)(iVar1 - iVar3));
            local_3c = local_3c + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + local_40;
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar12 = 0; uVar12 != 5; uVar12 = uVar12 + 1) {
    iVar4 = xmlMemBlocks();
    pxVar8 = gen_xmlXPathObjectPtr(uVar12,(int)in_RSI);
    xmlShellPrintXPathResult(pxVar8);
    call_tests = call_tests + 1;
    if (pxVar8 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar8);
    }
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar4 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlShellPrintXPathResult",(ulong)(uint)(iVar1 - iVar4));
      test_ret_1 = test_ret_1 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_40 = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellPwd(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_12);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_13);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellPwd",(ulong)(uint)(iVar1 - iVar3));
            local_40 = local_40 + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + test_ret + local_3c;
  function_tests = function_tests + 1;
  uVar10 = 1;
  test_ret = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellSave(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_14);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_15);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellSave",(ulong)(uint)(iVar1 - iVar3));
            test_ret = test_ret + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_3c = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellValidate(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_16);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_17);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellValidate",(ulong)(uint)(iVar1 - iVar3));
            local_3c = local_3c + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  iVar11 = iVar11 + test_ret_1 + local_40;
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_40 = 0;
  while (uVar10 != 0) {
    pxVar9 = (xmlDocPtr)0x1;
    while (uVar10 = 0, pxVar9 != (xmlDocPtr)0x0) {
      while( true ) {
        pxVar9 = (xmlDocPtr)0x0;
        iVar4 = (int)uVar10;
        if (iVar4 == 3) break;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar9;
          if (iVar2 == 3) break;
          iVar3 = xmlMemBlocks();
          pxVar7 = gen_xmlNodePtr(iVar4,iVar1);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar1);
          xmlShellWrite(0,0,pxVar7,in_RSI);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar4,pxVar7,nr_18);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_19);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar3 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellWrite",(ulong)(uint)(iVar1 - iVar3));
            local_40 = local_40 + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar10 = (ulong)(iVar4 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  uVar12 = iVar11 + test_ret + local_3c + local_40;
  if (uVar12 != 0) {
    printf("Module debugXML: %d errors\n",(ulong)uVar12);
  }
  return uVar12;
}

Assistant:

static int
test_debugXML(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing debugXML : 25 of 28 functions ...\n");
    test_ret += test_xmlBoolToText();
    test_ret += test_xmlDebugCheckDocument();
    test_ret += test_xmlDebugDumpAttr();
    test_ret += test_xmlDebugDumpAttrList();
    test_ret += test_xmlDebugDumpDTD();
    test_ret += test_xmlDebugDumpDocument();
    test_ret += test_xmlDebugDumpDocumentHead();
    test_ret += test_xmlDebugDumpEntities();
    test_ret += test_xmlDebugDumpNode();
    test_ret += test_xmlDebugDumpNodeList();
    test_ret += test_xmlDebugDumpOneNode();
    test_ret += test_xmlDebugDumpString();
    test_ret += test_xmlLsCountNode();
    test_ret += test_xmlLsOneNode();
    test_ret += test_xmlShell();
    test_ret += test_xmlShellBase();
    test_ret += test_xmlShellCat();
    test_ret += test_xmlShellDir();
    test_ret += test_xmlShellDu();
    test_ret += test_xmlShellList();
    test_ret += test_xmlShellLoad();
    test_ret += test_xmlShellPrintXPathResult();
    test_ret += test_xmlShellPwd();
    test_ret += test_xmlShellSave();
    test_ret += test_xmlShellValidate();
    test_ret += test_xmlShellWrite();

    if (test_ret != 0)
	printf("Module debugXML: %d errors\n", test_ret);
    return(test_ret);
}